

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall
JsonString_TwoUtf16Chars_Test::JsonString_TwoUtf16Chars_Test(JsonString_TwoUtf16Chars_Test *this)

{
  anon_unknown.dwarf_1a1265::JsonString::JsonString(&this->super_JsonString);
  (this->super_JsonString).super_Test._vptr_Test = (_func_int **)&PTR__JsonString_001ad248;
  return;
}

Assistant:

TEST_F (JsonString, TwoUtf16Chars) {
    // Encoding for TURNED AMPERSAND (U+214B) followed by KATAKANA LETTER SMALL A (u+30A1)
    // expressed as a pair of UTF-16 characters.
    EXPECT_CALL (callbacks_, string_value ("\xE2\x85\x8B\xE3\x82\xA1")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input (R"("\u214B\u30A1")").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{15U, 1U}));
}